

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nap_comm_struct.hpp
# Opt level: O2

void __thiscall comm_pkg::comm_pkg(comm_pkg *this)

{
  comm_data *pcVar1;
  
  pcVar1 = (comm_data *)operator_new(0x20);
  pcVar1->num_msgs = 0;
  pcVar1->size_msgs = 0;
  pcVar1->procs = (int *)0x0;
  pcVar1->indptr = (int *)0x0;
  pcVar1->indices = (int *)0x0;
  this->send_data = pcVar1;
  pcVar1 = (comm_data *)operator_new(0x20);
  pcVar1->num_msgs = 0;
  pcVar1->size_msgs = 0;
  pcVar1->procs = (int *)0x0;
  pcVar1->indptr = (int *)0x0;
  pcVar1->indices = (int *)0x0;
  this->recv_data = pcVar1;
  return;
}

Assistant:

comm_pkg()
    {
        send_data = new comm_data();
        recv_data = new comm_data();
    }